

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getFileMode(char *zFile,mode_t *pMode,uid_t *pUid,gid_t *pGid)

{
  int iVar1;
  int local_bc;
  undefined1 local_b8 [4];
  int rc;
  stat sStat;
  gid_t *pGid_local;
  uid_t *pUid_local;
  mode_t *pMode_local;
  char *zFile_local;
  
  local_bc = 0;
  sStat.__glibc_reserved[2] = (__syscall_slong_t)pGid;
  iVar1 = (*aSyscall[4].pCurrent)(zFile,local_b8);
  if (iVar1 == 0) {
    *pMode = (uint)sStat.st_nlink & 0x1ff;
    *pUid = sStat.st_nlink._4_4_;
    *(__mode_t *)sStat.__glibc_reserved[2] = sStat.st_mode;
  }
  else {
    local_bc = 0x70a;
  }
  return local_bc;
}

Assistant:

static int getFileMode(
  const char *zFile,              /* File name */
  mode_t *pMode,                  /* OUT: Permissions of zFile */
  uid_t *pUid,                    /* OUT: uid of zFile. */
  gid_t *pGid                     /* OUT: gid of zFile. */
){
  struct stat sStat;              /* Output of stat() on database file */
  int rc = SQLITE_OK;
  if( 0==osStat(zFile, &sStat) ){
    *pMode = sStat.st_mode & 0777;
    *pUid = sStat.st_uid;
    *pGid = sStat.st_gid;
  }else{
    rc = SQLITE_IOERR_FSTAT;
  }
  return rc;
}